

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cpp
# Opt level: O3

bool __thiscall libcellml::Model::hasUnlinkedUnits(Model *this)

{
  bool bVar1;
  size_t sVar2;
  ulong uVar3;
  bool bVar4;
  ComponentPtr c;
  ComponentEntity local_30;
  
  sVar2 = ComponentEntity::componentCount(&this->super_ComponentEntity);
  if (sVar2 == 0) {
    bVar1 = false;
  }
  else {
    uVar3 = 1;
    do {
      ComponentEntity::component(&local_30,(size_t)this);
      bVar1 = traverseComponentTreeForUnlinkedUnits((ComponentPtr *)&local_30);
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_30.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_30.super_NamedEntity.super_ParentedEntity.super_Entity.mPimpl);
      }
      sVar2 = ComponentEntity::componentCount(&this->super_ComponentEntity);
      bVar4 = uVar3 < sVar2;
      uVar3 = uVar3 + 1;
    } while (bVar4 && !bVar1);
  }
  return bVar1;
}

Assistant:

bool Model::hasUnlinkedUnits()
{
    bool unlinkedUnits = false;
    for (size_t index = 0; index < componentCount() && !unlinkedUnits; ++index) {
        auto c = component(index);
        unlinkedUnits = traverseComponentTreeForUnlinkedUnits(c);
    }
    return unlinkedUnits;
}